

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O1

UBool __thiscall
icu_63::RuleBasedBreakIterator::operator==(RuleBasedBreakIterator *this,BreakIterator *that)

{
  char *__s1;
  char *__s2;
  RBBIDataWrapper *this_00;
  RBBIDataWrapper *other;
  UBool UVar1;
  int iVar2;
  
  __s1 = *(char **)((this->super_BreakIterator).super_UObject._vptr_UObject[-1] + 8);
  __s2 = *(char **)((that->super_UObject)._vptr_UObject[-1] + 8);
  if ((__s1 == __s2) || ((*__s1 != '*' && (iVar2 = strcmp(__s1,__s2), iVar2 == 0)))) {
    if (this == (RuleBasedBreakIterator *)that) {
      return '\x01';
    }
    UVar1 = utext_equals_63(&this->fText,(UText *)(that + 1));
    if ((((UVar1 != '\0') && (this->fPosition == *(int *)(that[1].actualLocale + 0x90))) &&
        (this->fRuleStatusIndex == *(int *)(that[1].actualLocale + 0x94))) &&
       (this->fDone == that[1].validLocale[0x8b])) {
      this_00 = *(RBBIDataWrapper **)(that[1].actualLocale + 0x88);
      other = this->fData;
      if (this_00 == other) {
        return '\x01';
      }
      if ((this_00 != (RBBIDataWrapper *)0x0 && other != (RBBIDataWrapper *)0x0) &&
         (UVar1 = RBBIDataWrapper::operator==(this_00,other), UVar1 != '\0')) {
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

UBool
RuleBasedBreakIterator::operator==(const BreakIterator& that) const {
    if (typeid(*this) != typeid(that)) {
        return FALSE;
    }
    if (this == &that) {
        return TRUE;
    }

    // The base class BreakIterator carries no state that participates in equality,
    // and does not implement an equality function that would otherwise be
    // checked at this point.

    const RuleBasedBreakIterator& that2 = (const RuleBasedBreakIterator&) that;

    if (!utext_equals(&fText, &that2.fText)) {
        // The two break iterators are operating on different text,
        //   or have a different iteration position.
        //   Note that fText's position is always the same as the break iterator's position.
        return FALSE;
    };

    if (!(fPosition == that2.fPosition &&
            fRuleStatusIndex == that2.fRuleStatusIndex &&
            fDone == that2.fDone)) {
        return FALSE;
    }

    if (that2.fData == fData ||
        (fData != NULL && that2.fData != NULL && *that2.fData == *fData)) {
            // The two break iterators are using the same rules.
            return TRUE;
        }
    return FALSE;
}